

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::RangeSink::AddFileRange
          (RangeSink *this,char *analyzer,string_view name,uint64_t fileoff,uint64_t filesize)

{
  string_view value;
  string_view format;
  bool bVar1;
  size_type sVar2;
  const_pointer pvVar3;
  undefined8 uVar4;
  Arg *in_RCX;
  Arg *in_RDX;
  Arg *in_RSI;
  RangeSink *in_RDI;
  uint64_t in_R8;
  DualMap *in_R9;
  bool ok;
  string label;
  pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *pair;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  *__range1;
  bool verbose;
  DualMap *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  DataSource in_stack_fffffffffffffe64;
  char *in_stack_fffffffffffffe68;
  Arg *in_stack_fffffffffffffe70;
  Arg *a2;
  Arg *a1;
  Arg *in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffea0 [15];
  undefined1 in_stack_fffffffffffffeaf;
  RangeMap *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  uint64_t in_stack_fffffffffffffec0;
  uint64_t in_stack_fffffffffffffec8;
  RangeMap *in_stack_fffffffffffffed0;
  RangeMap *in_stack_fffffffffffffee0;
  string local_c0 [24];
  NameMunger *in_stack_ffffffffffffff58;
  string_view in_stack_ffffffffffffff60;
  string local_78 [32];
  reference local_58;
  pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *local_50;
  __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
  local_48;
  vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  *local_40;
  undefined1 local_31;
  DualMap *local_30;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_30 = in_R9;
  local_10._M_len = (size_t)in_RDX;
  local_10._M_str = (char *)in_RCX;
  local_31 = IsVerboseForFileRange(in_RDI,(uint64_t)in_RSI,in_R8);
  if ((bool)local_31) {
    in_stack_fffffffffffffe70 = in_RSI;
    in_stack_fffffffffffffe68 = GetDataSourceLabel(in_stack_fffffffffffffe64);
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_10);
    pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_10);
    printf("[%s, %s] AddFileRange(%.*s, %lx, %lx)\n",in_stack_fffffffffffffe68,
           in_stack_fffffffffffffe70,sVar2 & 0xffffffff,pvVar3,in_R8);
    in_stack_fffffffffffffe58 = local_30;
  }
  local_40 = &in_RDI->outputs_;
  local_48._M_current =
       (pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *)
       std::
       vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
       ::begin((vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                *)in_stack_fffffffffffffe58);
  local_50 = (pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *)
             std::
             vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
             ::end((vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                    *)in_stack_fffffffffffffe58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                            (__normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
                             *)in_stack_fffffffffffffe58), bVar1) {
    local_58 = __gnu_cxx::
               __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
               ::operator*(&local_48);
    NameMunger::Munge_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
    if (in_RDI->translator_ == (DualMap *)0x0) {
      RangeMap::AddRange((RangeMap *)in_stack_fffffffffffffe70,(uint64_t)in_stack_fffffffffffffe68,
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         (string *)in_stack_fffffffffffffe58);
    }
    else {
      in_stack_fffffffffffffe58 = local_58->first;
      bVar1 = RangeMap::AddRangeWithTranslation
                        (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                         in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                         in_stack_fffffffffffffeb0,(bool)in_stack_fffffffffffffeaf,
                         in_stack_fffffffffffffee0);
      in_stack_fffffffffffffe64 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe64);
      if ((!bVar1) && (0 < verbose_level)) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&in_stack_fffffffffffffe70->piece_,in_stack_fffffffffffffe68);
        absl::substitute_internal::Arg::Arg
                  (in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68);
        absl::substitute_internal::Arg::Arg
                  (in_stack_fffffffffffffe70,(unsigned_long)in_stack_fffffffffffffe68);
        value._M_str = local_10._M_str;
        value._M_len = local_10._M_len;
        a2 = (Arg *)local_10._M_len;
        a1 = (Arg *)local_10._M_str;
        absl::substitute_internal::Arg::Arg((Arg *)&stack0xfffffffffffffea0,value);
        format._M_str._7_1_ = in_stack_fffffffffffffeaf;
        format._0_15_ = in_stack_fffffffffffffea0;
        absl::Substitute_abi_cxx11_(format,in_stack_fffffffffffffe98,a1,a2);
        uVar4 = std::__cxx11::string::c_str();
        printf("WARNING: %s\n",uVar4);
        std::__cxx11::string::~string(local_c0);
      }
    }
    std::__cxx11::string::~string(local_78);
    __gnu_cxx::
    __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
    ::operator++(&local_48);
  }
  return;
}

Assistant:

void RangeSink::AddFileRange(const char* analyzer, string_view name,
                             uint64_t fileoff, uint64_t filesize) {
  bool verbose = IsVerboseForFileRange(fileoff, filesize);
  if (verbose) {
    printf("[%s, %s] AddFileRange(%.*s, %" PRIx64 ", %" PRIx64 ")\n",
           GetDataSourceLabel(data_source_), analyzer, (int)name.size(),
           name.data(), fileoff, filesize);
  }
  for (auto& pair : outputs_) {
    const std::string label = pair.second->Munge(name);
    if (translator_) {
      bool ok = pair.first->file_map.AddRangeWithTranslation(
          fileoff, filesize, label, translator_->file_map, verbose,
          &pair.first->vm_map);
      if (!ok) {
        WARN("File range ($0, $1) for label $2 extends beyond base map",
             fileoff, filesize, name);
      }
    } else {
      pair.first->file_map.AddRange(fileoff, filesize, label);
    }
  }
}